

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfHeader.h
# Opt level: O0

TypedAttribute<Imf_3_4::PreviewImage> * __thiscall
Imf_3_4::Header::typedAttribute<Imf_3_4::TypedAttribute<Imf_3_4::PreviewImage>>
          (Header *this,char *name)

{
  Attribute *pAVar1;
  TypeExc *this_00;
  TypedAttribute<Imf_3_4::PreviewImage> *tattr;
  Attribute *attr;
  char *in_stack_00000278;
  Header *in_stack_00000280;
  TypedAttribute<Imf_3_4::PreviewImage> *local_40;
  
  pAVar1 = operator[](in_stack_00000280,in_stack_00000278);
  if (pAVar1 == (Attribute *)0x0) {
    local_40 = (TypedAttribute<Imf_3_4::PreviewImage> *)0x0;
  }
  else {
    local_40 = (TypedAttribute<Imf_3_4::PreviewImage> *)
               __dynamic_cast(pAVar1,&Attribute::typeinfo,
                              &TypedAttribute<Imf_3_4::PreviewImage>::typeinfo,0);
  }
  if (local_40 == (TypedAttribute<Imf_3_4::PreviewImage> *)0x0) {
    this_00 = (TypeExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::TypeExc::TypeExc(this_00,"Unexpected attribute type.");
    __cxa_throw(this_00,&Iex_3_4::TypeExc::typeinfo,Iex_3_4::TypeExc::~TypeExc);
  }
  return local_40;
}

Assistant:

const T&
Header::typedAttribute (const char name[]) const
{
    const Attribute* attr  = &(*this)[name];
    const T*         tattr = dynamic_cast<const T*> (attr);

    if (tattr == 0) throw IEX_NAMESPACE::TypeExc ("Unexpected attribute type.");

    return *tattr;
}